

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::LabelPattern::TryToGenerateCode
          (LabelPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  ConstLabelPtr this_00;
  CLabelStatement *local_b0;
  CLabel local_90;
  CLabel local_70;
  shared_ptr<AssemblyCode::LabelCommand> local_50;
  CLabelStatement *local_40;
  ConstLabelPtr labelPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  LabelPattern *this_local;
  
  labelPtr = (ConstLabelPtr)commands;
  commands_local = (AssemblyCommands *)children;
  children_local = (ChildrenTemps *)dest;
  dest_local = (CTemp *)tree;
  tree_local = (INode *)this;
  if (tree == (INode *)0x0) {
    local_b0 = (CLabelStatement *)0x0;
  }
  else {
    local_b0 = (CLabelStatement *)__dynamic_cast(tree,&INode::typeinfo,&CLabelStatement::typeinfo,0)
    ;
  }
  this_00 = labelPtr;
  local_40 = local_b0;
  if (local_b0 != (CLabelStatement *)0x0) {
    CLabelStatement::Label(&local_90,local_b0);
    CLabel::ToString_abi_cxx11_(&local_70);
    std::make_shared<AssemblyCode::LabelCommand,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
    ::emplace_back<std::shared_ptr<AssemblyCode::LabelCommand>>
              ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                *)this_00,&local_50);
    std::shared_ptr<AssemblyCode::LabelCommand>::~shared_ptr(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    CLabel::~CLabel(&local_90);
  }
  return local_b0 != (CLabelStatement *)0x0;
}

Assistant:

bool IRT::LabelPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                           AssemblyCommands &commands ) {
    ConstLabelPtr labelPtr = dynamic_cast<ConstLabelPtr>(tree);
    if ( labelPtr ) {
        commands.emplace_back( std::make_shared<AssemblyCode::LabelCommand>( labelPtr->Label( ).ToString( )));
        return true;
    }
    return false;
}